

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O0

void AddInclude(ZCC_ExprConstant *node)

{
  uint uVar1;
  uint uVar2;
  undefined1 local_20 [24];
  ZCC_ExprConstant *node_local;
  
  local_20._16_8_ = node;
  if ((node->super_ZCC_Expression).Type == (PType *)TypeString) {
    uVar1 = TArray<FString,_FString>::Find(&Includes,(node->field_0).StringVal);
    uVar2 = TArray<FString,_FString>::Size(&Includes);
    if (uVar2 <= uVar1) {
      TArray<FString,_FString>::Push
                (&Includes,
                 ((anon_union_8_4_c6e8ba38_for_ZCC_ExprConstant_1 *)(local_20._16_8_ + 0x38))->
                 StringVal);
      ZCC_TreeNode::operator_cast_to_FScriptPosition((ZCC_TreeNode *)local_20);
      TArray<FScriptPosition,_FScriptPosition>::Push(&IncludeLocs,(FScriptPosition *)local_20);
      FScriptPosition::~FScriptPosition((FScriptPosition *)local_20);
    }
    return;
  }
  __assert_fail("node->Type == TypeString",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_parser.cpp"
                ,0x35,"void AddInclude(ZCC_ExprConstant *)");
}

Assistant:

void AddInclude(ZCC_ExprConstant *node)
{
	assert(node->Type == TypeString);
	if (Includes.Find(*node->StringVal) >= Includes.Size())
	{
		Includes.Push(*node->StringVal);
		IncludeLocs.Push(*node);
	}
}